

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

future<void> DelayedSetChannel(int channel,int value,double delay)

{
  element_type *in_RDI;
  future<void> fVar1;
  type run;
  type *in_stack_00000040;
  launch in_stack_0000004c;
  
  fVar1 = std::async<DelayedSetChannel(int,int,double)::__0&>(in_stack_0000004c,in_stack_00000040);
  fVar1.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (future<void>)
         fVar1.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<void> DelayedSetChannel(int channel, int value, double delay)
{
    auto run = [=]()
    {
        sleep(delay);
        GPIO::output(channel, value);
    };

    return std::async(std::launch::async, run);
}